

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O3

Bounds3f * __thiscall pbrt::Disk::Bounds(Bounds3f *__return_storage_ptr__,Disk *this)

{
  Float FVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  Bounds3f local_20;
  
  FVar1 = this->radius;
  local_20.pMin.super_Tuple3<pbrt::Point3,_float>.z = this->height;
  auVar2._8_4_ = 0x80000000;
  auVar2._0_8_ = 0x8000000080000000;
  auVar2._12_4_ = 0x80000000;
  auVar2 = vxorps_avx512vl(ZEXT416((uint)FVar1),auVar2);
  auVar3 = vminss_avx(ZEXT416((uint)FVar1),auVar2);
  auVar2 = vmaxss_avx(ZEXT416((uint)FVar1),auVar2);
  auVar4._0_4_ = auVar3._0_4_;
  auVar4._4_4_ = auVar4._0_4_;
  auVar4._8_4_ = auVar4._0_4_;
  auVar4._12_4_ = auVar4._0_4_;
  auVar3._0_4_ = auVar2._0_4_;
  auVar3._4_4_ = auVar3._0_4_;
  auVar3._8_4_ = auVar3._0_4_;
  auVar3._12_4_ = auVar3._0_4_;
  local_20.pMin.super_Tuple3<pbrt::Point3,_float>._0_8_ = vmovlps_avx(auVar4);
  local_20.pMax.super_Tuple3<pbrt::Point3,_float>._0_8_ = vmovlps_avx(auVar3);
  local_20.pMax.super_Tuple3<pbrt::Point3,_float>.z =
       local_20.pMin.super_Tuple3<pbrt::Point3,_float>.z;
  Transform::operator()(__return_storage_ptr__,this->renderFromObject,&local_20);
  return __return_storage_ptr__;
}

Assistant:

Bounds3f Disk::Bounds() const {
    return (*renderFromObject)(
        Bounds3f(Point3f(-radius, -radius, height), Point3f(radius, radius, height)));
}